

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O0

list<int,_std::allocator<int>_> *
waitForValue<std::__cxx11::list<int,std::allocator<int>>>
          (list<int,_std::allocator<int>_> *__return_storage_ptr__,
          QPromise<std::__cxx11::list<int,_std::allocator<int>_>_> *promise,
          list<int,_std::allocator<int>_> *initial)

{
  QPromise<void> local_48;
  QPromiseBase<void> local_38;
  undefined1 local_21;
  list<int,_std::allocator<int>_> *local_20;
  list<int,_std::allocator<int>_> *initial_local;
  QPromise<std::__cxx11::list<int,_std::allocator<int>_>_> *promise_local;
  list<int,_std::allocator<int>_> *value;
  
  local_21 = 0;
  local_20 = initial;
  initial_local = (list<int,_std::allocator<int>_> *)promise;
  promise_local = (QPromise<std::__cxx11::list<int,_std::allocator<int>_>_> *)__return_storage_ptr__
  ;
  std::__cxx11::list<int,_std::allocator<int>_>::list(__return_storage_ptr__,initial);
  QtPromise::QPromiseBase<std::__cxx11::list<int,std::allocator<int>>>::
  then<waitForValue<std::__cxx11::list<int,std::allocator<int>>>(QtPromise::QPromise<std::__cxx11::list<int,std::allocator<int>>>const&,std::__cxx11::list<int,std::allocator<int>>const&)::_lambda(std::__cxx11::list<int,std::allocator<int>>const&)_1_>
            ((QPromiseBase<std::__cxx11::list<int,std::allocator<int>>> *)&local_48,
             (anon_class_8_1_a8c68091 *)initial_local);
  QtPromise::QPromiseBase<void>::wait(&local_38,&local_48);
  QtPromise::QPromise<void>::~QPromise((QPromise<void> *)&local_38);
  QtPromise::QPromise<void>::~QPromise(&local_48);
  return __return_storage_ptr__;
}

Assistant:

static inline T waitForValue(const QtPromise::QPromise<T>& promise, const T& initial)
{
    T value(initial);
    promise
        .then([&](const T& res) {
            value = res;
        })
        .wait();
    return value;
}